

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_Truth3VarN(uint **puCanons,char ***puPhases,char **ppCounters)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int v;
  uint *__ptr;
  char *__ptr_00;
  char **__ptr_01;
  char **ppcVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  
  __ptr = (uint *)calloc(1,0x400);
  __ptr_00 = (char *)calloc(1,0x100);
  __ptr_01 = (char **)malloc(0x1000);
  ppcVar5 = __ptr_01 + 0x100;
  *__ptr_01 = (char *)ppcVar5;
  auVar4 = _DAT_0094e250;
  auVar3 = _DAT_0094e240;
  lVar13 = 1;
  lVar14 = 2;
  lVar8 = 0;
  do {
    auVar15._8_4_ = (int)lVar8;
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar15 = (auVar15 | auVar3) ^ auVar4;
    if (auVar15._4_4_ == -0x80000000 && auVar15._0_4_ < -0x7fffff01) {
      __ptr_01[lVar8 + 1] = (char *)(ppcVar5 + lVar13);
      __ptr_01[lVar8 + 2] = (char *)(ppcVar5 + lVar14);
    }
    lVar8 = lVar8 + 2;
    lVar13 = lVar13 + 2;
    lVar14 = lVar14 + 2;
  } while (lVar8 != 0x100);
  uVar9 = 0;
  do {
    uVar10 = uVar9 * 0x1010101;
    uVar6 = (ulong)__ptr[uVar9];
    if (uVar6 == 0) {
      uVar11 = 0;
      do {
        puVar12 = Extra_TruthPolarize::Signs;
        lVar8 = 0;
        uVar6 = uVar9 & 0xffffffff;
        do {
          if ((uVar11 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
            bVar7 = (byte)(1 << ((byte)lVar8 & 0x1f));
            uVar6 = (ulong)((*puVar12 & (uint)uVar6) >> (bVar7 & 0x1f) |
                           (~*puVar12 & (uint)uVar6) << (bVar7 & 0x1f));
          }
          lVar8 = lVar8 + 1;
          puVar12 = puVar12 + 1;
        } while (lVar8 != 3);
        if (((ulong)__ptr[uVar6] == 0) && (uVar9 != 0 || uVar11 == 0)) {
          __ptr[uVar6] = (uint)uVar10;
          *__ptr_01[uVar6] = (char)uVar11;
          __ptr_00[uVar6] = '\x01';
        }
        else {
          if (uVar10 - __ptr[uVar6] != 0) {
            __assert_fail("uCanons[uPhase] == uTruth32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                          ,0x30f,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
          }
          cVar1 = __ptr_00[uVar6];
          if ((long)cVar1 < 8) {
            pcVar2 = __ptr_01[uVar6];
            __ptr_00[uVar6] = cVar1 + '\x01';
            pcVar2[cVar1] = (char)uVar11;
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 8);
    }
    else if (uVar10 < uVar6 || uVar10 - uVar6 == 0) {
      __assert_fail("uTruth32 > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x300,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x100);
  if (puCanons == (uint **)0x0) {
    free(__ptr);
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char ***)0x0) {
    free(__ptr_01);
  }
  else {
    *puPhases = __ptr_01;
  }
  if (ppCounters == (char **)0x0) {
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
      return;
    }
  }
  else {
    *ppCounters = __ptr_00;
  }
  return;
}

Assistant:

void Extra_Truth3VarN( unsigned ** puCanons, char *** puPhases, char ** ppCounters )
{
    int nPhasesMax = 8;
    unsigned * uCanons;
    unsigned uTruth, uPhase, uTruth32;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 8);
    uCanons = ABC_ALLOC( unsigned, nFuncs );
    memset( uCanons, 0, sizeof(unsigned) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        uTruth32 = ((uTruth << 24) | (uTruth << 16) | (uTruth << 8) | uTruth);
        if ( uCanons[uTruth] )
        {
            assert( uTruth32 > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 8; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 3 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth32;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth32 );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 3N-classes = %d.\n", nClasses );
}